

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O1

string * __thiscall
polyscope::render::ManagedBuffer<glm::vec<2,float,(glm::qualifier)0>>::summaryString_abi_cxx11_
          (string *__return_storage_ptr__,ManagedBuffer<glm::vec<2,float,(glm::qualifier)0>> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  CanonicalDataSource CVar5;
  long *plVar6;
  size_t __val;
  long *plVar7;
  size_t sVar8;
  string __str;
  long *local_78;
  long local_68;
  long lStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  local_58 = &__return_storage_ptr__->field_2;
  std::operator+(&local_50,"[",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 8));
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_68 = *plVar7;
    lStack_60 = plVar6[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar7;
    local_78 = (long *)*plVar6;
  }
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  CVar5 = ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>::currentCanonicalDataSource
                    ((ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_> *)this);
  if (CVar5 < (RenderBuffer|NeedsCompute)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  __val = ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>::size
                    ((ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_> *)this);
  cVar4 = '\x01';
  if (9 < __val) {
    sVar8 = __val;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (sVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00213a4b;
      }
      if (sVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00213a4b;
      }
      if (sVar8 < 10000) goto LAB_00213a4b;
      bVar2 = 99999 < sVar8;
      sVar8 = sVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00213a4b:
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_50._M_dataplus._M_p,(uint)local_50._M_string_length,__val);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x34b53e);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_68 = *plVar7;
    lStack_60 = plVar6[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar7;
    local_78 = (long *)*plVar6;
  }
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (*(uint *)(this + 0x90) < 4) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ManagedBuffer<T>::summaryString() {

  std::string str = "";

  str += "[" + name + "]";
  str += "   status: ";
  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    str += "HostData";
    break;
  case CanonicalDataSource::NeedsCompute:
    str += "NeedsCompute";
    break;
  case CanonicalDataSource::RenderBuffer:
    str += "Renderbuffer";
    break;
  };
  str += " size: " + std::to_string(size());
  str += " device type: ";
  switch (deviceBufferType) {
  case DeviceBufferType::Attribute:
    str += "Attribute";
    break;
  case DeviceBufferType::Texture1d:
    str += "Texture1d";
    break;
  case DeviceBufferType::Texture2d:
    str += "Texture2d";
    break;
  case DeviceBufferType::Texture3d:
    str += "Texture3d";
    break;
  }

  return str;
}